

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

void helper_sve_rev_p_aarch64(void *vd,void *vn,uint32_t pred_desc)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint n;
  intptr_t il;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  uVar8 = pred_desc & 0x1f;
  uVar3 = uVar8 + 2;
  uVar6 = (ulong)uVar3;
  n = pred_desc >> 10 & 3;
  if (uVar8 < 7) {
    uVar4 = reverse_bits_64(*vn << ((char)uVar3 * -8 & 0x3fU),n);
    *(uint64_t *)vd = uVar4;
  }
  else if ((uVar3 & 0xf) == 0) {
    for (uVar7 = 0; uVar6 = uVar6 - 8, uVar7 < uVar3 >> 1; uVar7 = uVar7 + 8) {
      uVar4 = reverse_bits_64(*(uint64_t *)((long)vn + uVar7),n);
      uVar5 = reverse_bits_64(*(uint64_t *)((long)vn + uVar6),n);
      *(uint64_t *)((long)vd + uVar7) = uVar5;
      *(uint64_t *)((long)vd + uVar6) = uVar4;
    }
  }
  else {
    lVar9 = (ulong)uVar8 + 1;
    for (uVar6 = 0; uVar3 >> 1 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = reverse_bits_8(*(uint8_t *)((long)vn + uVar6),n);
      uVar2 = reverse_bits_8(*(uint8_t *)((long)vn + lVar9),n);
      *(uint8_t *)((long)vd + uVar6) = uVar2;
      *(uint8_t *)((long)vd + lVar9) = uVar1;
      lVar9 = lVar9 + -1;
    }
  }
  return;
}

Assistant:

void HELPER(sve_rev_p)(void *vd, void *vn, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    int esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    intptr_t i, oprsz_2 = oprsz / 2;

    if (oprsz <= 8) {
        uint64_t l = *(uint64_t *)vn;
        l = reverse_bits_64(l << (64 - 8 * oprsz), esz);
        *(uint64_t *)vd = l;
    } else if ((oprsz & 15) == 0) {
        for (i = 0; i < oprsz_2; i += 8) {
            intptr_t ih = oprsz - 8 - i;
            uint64_t l = reverse_bits_64(*(uint64_t *)((char *)vn + i), esz);
            uint64_t h = reverse_bits_64(*(uint64_t *)((char *)vn + ih), esz);
            *(uint64_t *)((char *)vd + i) = h;
            *(uint64_t *)((char *)vd + ih) = l;
        }
    } else {
        for (i = 0; i < oprsz_2; i += 1) {
            intptr_t il = H1(i);
            intptr_t ih = H1(oprsz - 1 - i);
            uint8_t l = reverse_bits_8(*(uint8_t *)((char *)vn + il), esz);
            uint8_t h = reverse_bits_8(*(uint8_t *)((char *)vn + ih), esz);
            *(uint8_t *)((char *)vd + il) = h;
            *(uint8_t *)((char *)vd + ih) = l;
        }
    }
}